

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

p_ply_element ply_get_next_element(p_ply ply,p_ply_element last)

{
  p_ply_element ptVar1;
  
  if (last != (p_ply_element)0x0) {
    ptVar1 = (p_ply_element)0x0;
    if (last + 1 < ply->element + ply->nelements) {
      ptVar1 = last + 1;
    }
    return ptVar1;
  }
  return ply->element;
}

Assistant:

p_ply_element ply_get_next_element(p_ply ply, p_ply_element last) {
    assert(ply);
    if (!last) return ply->element;
    last++;
    if (last < ply->element + ply->nelements)
        return last;
    else
        return NULL;
}